

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

void Cec_ManSatSolveMiter_rec(Cec_ManSat_t *pSat,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  pGVar3 = p->pObjs;
  if (pGVar3 <= pObj) {
    do {
      if (pGVar3 + p->nObjs <= pObj) break;
      iVar4 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar4) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[iVar4] == p->nTravIds) {
        return;
      }
      p->pTravIds[iVar4] = p->nTravIds;
      uVar2 = (uint)*(undefined8 *)pObj;
      if ((~uVar2 & 0x9fffffff) == 0) {
        pSat->nCexLits = pSat->nCexLits + 1;
        uVar1 = *(ulong *)pObj;
        if (-1 < (int)uVar1) {
          __assert_fail("pObj->fTerm",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ac,"int Gia_ObjCioId(Gia_Obj_t *)");
        }
        p_00 = pSat->vCex;
        uVar2 = Cec_ObjSatVarValue(pSat,pObj);
        Vec_IntPush(p_00,((uint)(uVar1 >> 0x1f) & 0x3ffffffe | uVar2) ^ 1);
        return;
      }
      if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                      ,0x3dd,
                      "void Cec_ManSatSolveMiter_rec(Cec_ManSat_t *, Gia_Man_t *, Gia_Obj_t *)");
      }
      Cec_ManSatSolveMiter_rec(pSat,p,pObj + -(ulong)(uVar2 & 0x1fffffff));
      pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar3 = p->pObjs;
    } while (pGVar3 <= pObj);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_ManSatSolveMiter_rec( Cec_ManSat_t * pSat, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        pSat->nCexLits++;
        Vec_IntPush( pSat->vCex, Abc_Var2Lit( Gia_ObjCioId(pObj), !Cec_ObjSatVarValue(pSat, pObj) ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Cec_ManSatSolveMiter_rec( pSat, p, Gia_ObjFanin0(pObj) );
    Cec_ManSatSolveMiter_rec( pSat, p, Gia_ObjFanin1(pObj) );
}